

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

EVstone INT_REValloc_stone(CMConnection conn)

{
  int condition;
  CMFormat format;
  EValloc_stone_request request;
  EV_int_response response;
  int local_2c;
  undefined1 local_28 [4];
  EVstone local_24;
  
  local_2c = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EValloc_stone_req_formats);
  local_2c = condition;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EValloc_stone_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_28);
  INT_CMwrite(conn,format,&local_2c);
  INT_CMCondition_wait(conn->cm,condition);
  return local_24;
}

Assistant:

extern EVstone
INT_REValloc_stone(CMConnection conn)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EValloc_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EValloc_stone_req_formats);
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EValloc_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}